

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  StackItemT<embree::NodeRefPtr<4>_> SVar8;
  StackItemT<embree::NodeRefPtr<4>_> SVar9;
  StackItemT<embree::NodeRefPtr<4>_> SVar10;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar11;
  undefined4 uVar12;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar13;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  float fVar86;
  float fVar90;
  float fVar91;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar100;
  undefined1 auVar99 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar112;
  float fVar113;
  undefined1 auVar111 [16];
  float fVar114;
  vbool<4> valid;
  undefined1 local_1238 [16];
  undefined1 (*local_1220) [16];
  long local_1218;
  ulong local_1210;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1078;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar14;
  
  pSVar13 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar12 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1098._4_4_ = uVar12;
  local_1098._0_4_ = uVar12;
  local_1098._8_4_ = uVar12;
  local_1098._12_4_ = uVar12;
  auVar81 = ZEXT1664(local_1098);
  uVar12 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10a8._4_4_ = uVar12;
  local_10a8._0_4_ = uVar12;
  local_10a8._8_4_ = uVar12;
  local_10a8._12_4_ = uVar12;
  auVar82 = ZEXT1664(local_10a8);
  uVar12 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_10b8._4_4_ = uVar12;
  local_10b8._0_4_ = uVar12;
  local_10b8._8_4_ = uVar12;
  local_10b8._12_4_ = uVar12;
  auVar85 = ZEXT1664(local_10b8);
  fVar101 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar109 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar114 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar92 = fVar101 * 0.99999964;
  fVar96 = fVar109 * 0.99999964;
  fVar98 = fVar114 * 0.99999964;
  fVar101 = fVar101 * 1.0000004;
  fVar109 = fVar109 * 1.0000004;
  fVar114 = fVar114 * 1.0000004;
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1210 = uVar20 ^ 0x10;
  iVar1 = (tray->tnear).field_0.i[k];
  auVar70._4_4_ = iVar1;
  auVar70._0_4_ = iVar1;
  auVar70._8_4_ = iVar1;
  auVar70._12_4_ = iVar1;
  iVar1 = (tray->tfar).field_0.i[k];
  auVar33 = ZEXT1664(CONCAT412(iVar1,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))));
  local_1220 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_10c8 = fVar92;
  fStack_10c4 = fVar92;
  fStack_10c0 = fVar92;
  fStack_10bc = fVar92;
  local_10d8 = fVar96;
  fStack_10d4 = fVar96;
  fStack_10d0 = fVar96;
  fStack_10cc = fVar96;
  local_10e8 = fVar98;
  fStack_10e4 = fVar98;
  fStack_10e0 = fVar98;
  fStack_10dc = fVar98;
  local_10f8 = fVar101;
  fStack_10f4 = fVar101;
  fStack_10f0 = fVar101;
  fStack_10ec = fVar101;
  local_1108 = fVar109;
  fStack_1104 = fVar109;
  fStack_1100 = fVar109;
  fStack_10fc = fVar109;
  local_1118 = fVar114;
  fStack_1114 = fVar114;
  fStack_1110 = fVar114;
  fStack_110c = fVar114;
  fVar113 = fVar114;
  fVar112 = fVar114;
  fVar110 = fVar114;
  fVar107 = fVar109;
  fVar105 = fVar109;
  fVar103 = fVar109;
  fVar100 = fVar101;
  fVar108 = fVar101;
  fVar106 = fVar101;
  fVar104 = fVar98;
  fVar102 = fVar98;
  fVar97 = fVar98;
  fVar95 = fVar96;
  fVar94 = fVar96;
  fVar93 = fVar96;
  fVar91 = fVar92;
  fVar90 = fVar92;
  fVar86 = fVar92;
LAB_004fa775:
  do {
    pSVar11 = pSVar13 + -1;
    pSVar13 = pSVar13 + -1;
    if ((float)pSVar11->dist <= *(float *)(ray + k * 4 + 0x80)) {
      uVar17 = (pSVar13->ptr).ptr;
      while ((uVar17 & 8) == 0) {
        auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + uVar20),auVar81._0_16_);
        auVar34._0_4_ = fVar86 * auVar35._0_4_;
        auVar34._4_4_ = fVar90 * auVar35._4_4_;
        auVar34._8_4_ = fVar91 * auVar35._8_4_;
        auVar34._12_4_ = fVar92 * auVar35._12_4_;
        auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + uVar18),auVar82._0_16_);
        auVar43._0_4_ = fVar93 * auVar35._0_4_;
        auVar43._4_4_ = fVar94 * auVar35._4_4_;
        auVar43._8_4_ = fVar95 * auVar35._8_4_;
        auVar43._12_4_ = fVar96 * auVar35._12_4_;
        auVar35 = vmaxps_avx(auVar34,auVar43);
        auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + uVar23),auVar85._0_16_);
        auVar44._0_4_ = fVar97 * auVar34._0_4_;
        auVar44._4_4_ = fVar102 * auVar34._4_4_;
        auVar44._8_4_ = fVar104 * auVar34._8_4_;
        auVar44._12_4_ = fVar98 * auVar34._12_4_;
        auVar34 = vmaxps_avx(auVar44,auVar70);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar35,auVar34);
        auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + local_1210),auVar81._0_16_);
        auVar45._0_4_ = fVar106 * auVar35._0_4_;
        auVar45._4_4_ = fVar108 * auVar35._4_4_;
        auVar45._8_4_ = fVar100 * auVar35._8_4_;
        auVar45._12_4_ = fVar101 * auVar35._12_4_;
        auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + (uVar18 ^ 0x10)),auVar82._0_16_)
        ;
        auVar53._0_4_ = fVar103 * auVar35._0_4_;
        auVar53._4_4_ = fVar105 * auVar35._4_4_;
        auVar53._8_4_ = fVar107 * auVar35._8_4_;
        auVar53._12_4_ = fVar109 * auVar35._12_4_;
        auVar35 = vminps_avx(auVar45,auVar53);
        auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + (uVar23 ^ 0x10)),auVar85._0_16_)
        ;
        auVar54._0_4_ = fVar110 * auVar34._0_4_;
        auVar54._4_4_ = fVar112 * auVar34._4_4_;
        auVar54._8_4_ = fVar113 * auVar34._8_4_;
        auVar54._12_4_ = fVar114 * auVar34._12_4_;
        auVar34 = vminps_avx(auVar54,auVar33._0_16_);
        auVar35 = vminps_avx(auVar35,auVar34);
        auVar35 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar35,2);
        uVar15 = vmovmskps_avx(auVar35);
        if (uVar15 == 0) {
          if (pSVar13 == stack) {
            return;
          }
          goto LAB_004fa775;
        }
        uVar15 = uVar15 & 0xff;
        uVar21 = uVar17 & 0xfffffffffffffff0;
        lVar22 = 0;
        for (uVar17 = (ulong)uVar15; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
          lVar22 = lVar22 + 1;
        }
        uVar17 = *(ulong *)(uVar21 + lVar22 * 8);
        uVar15 = uVar15 - 1 & uVar15;
        uVar14 = (ulong)uVar15;
        if (uVar15 != 0) {
          uVar3 = tNear.field_0.i[lVar22];
          lVar22 = 0;
          for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            lVar22 = lVar22 + 1;
          }
          uVar15 = uVar15 - 1 & uVar15;
          uVar19 = (ulong)uVar15;
          uVar14 = *(ulong *)(uVar21 + lVar22 * 8);
          uVar4 = tNear.field_0.i[lVar22];
          if (uVar15 == 0) {
            if (uVar3 < uVar4) {
              (pSVar13->ptr).ptr = uVar14;
              pSVar13->dist = uVar4;
              pSVar13 = pSVar13 + 1;
            }
            else {
              (pSVar13->ptr).ptr = uVar17;
              pSVar13->dist = uVar3;
              pSVar13 = pSVar13 + 1;
              uVar17 = uVar14;
            }
          }
          else {
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar17;
            auVar35 = vpunpcklqdq_avx(auVar35,ZEXT416(uVar3));
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar14;
            auVar34 = vpunpcklqdq_avx(auVar46,ZEXT416(uVar4));
            lVar22 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar22 = lVar22 + 1;
            }
            uVar15 = uVar15 - 1 & uVar15;
            uVar17 = (ulong)uVar15;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = *(ulong *)(uVar21 + lVar22 * 8);
            auVar44 = vpunpcklqdq_avx(auVar55,ZEXT416((uint)tNear.field_0.i[lVar22]));
            auVar43 = vpcmpgtd_avx(auVar34,auVar35);
            if (uVar15 == 0) {
              auVar45 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar34,auVar35,auVar45);
              auVar35 = vblendvps_avx(auVar35,auVar34,auVar45);
              auVar34 = vpcmpgtd_avx(auVar44,auVar43);
              auVar45 = vpshufd_avx(auVar34,0xaa);
              auVar34 = vblendvps_avx(auVar44,auVar43,auVar45);
              auVar43 = vblendvps_avx(auVar43,auVar44,auVar45);
              auVar44 = vpcmpgtd_avx(auVar43,auVar35);
              auVar44 = vpshufd_avx(auVar44,0xaa);
              SVar8 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar43,auVar35,auVar44);
              SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar35,auVar43,auVar44);
              *pSVar13 = SVar9;
              pSVar13[1] = SVar8;
              uVar17 = auVar34._0_8_;
              pSVar13 = pSVar13 + 2;
            }
            else {
              lVar22 = 0;
              for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                lVar22 = lVar22 + 1;
              }
              auVar66._8_8_ = 0;
              auVar66._0_8_ = *(ulong *)(uVar21 + lVar22 * 8);
              auVar53 = vpunpcklqdq_avx(auVar66,ZEXT416((uint)tNear.field_0.i[lVar22]));
              auVar45 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar34,auVar35,auVar45);
              auVar35 = vblendvps_avx(auVar35,auVar34,auVar45);
              auVar34 = vpcmpgtd_avx(auVar53,auVar44);
              auVar45 = vpshufd_avx(auVar34,0xaa);
              auVar34 = vblendvps_avx(auVar53,auVar44,auVar45);
              auVar44 = vblendvps_avx(auVar44,auVar53,auVar45);
              auVar45 = vpcmpgtd_avx(auVar44,auVar35);
              auVar53 = vpshufd_avx(auVar45,0xaa);
              auVar45 = vblendvps_avx(auVar44,auVar35,auVar53);
              SVar8 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar35,auVar44,auVar53);
              auVar35 = vpcmpgtd_avx(auVar34,auVar43);
              auVar44 = vpshufd_avx(auVar35,0xaa);
              auVar35 = vblendvps_avx(auVar34,auVar43,auVar44);
              auVar34 = vblendvps_avx(auVar43,auVar34,auVar44);
              auVar43 = vpcmpgtd_avx(auVar45,auVar34);
              auVar43 = vpshufd_avx(auVar43,0xaa);
              SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar45,auVar34,auVar43);
              SVar10 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar34,auVar45,auVar43);
              *pSVar13 = SVar8;
              pSVar13[1] = SVar10;
              pSVar13[2] = SVar9;
              uVar17 = auVar35._0_8_;
              pSVar13 = pSVar13 + 3;
            }
          }
        }
      }
      local_1218 = (ulong)((uint)uVar17 & 0xf) - 8;
      if (local_1218 != 0) {
        uVar17 = uVar17 & 0xfffffffffffffff0;
        lVar22 = 0;
        do {
          lVar16 = lVar22 * 0xb0;
          uVar12 = *(undefined4 *)(ray + k * 4);
          auVar24._4_4_ = uVar12;
          auVar24._0_4_ = uVar12;
          auVar24._8_4_ = uVar12;
          auVar24._12_4_ = uVar12;
          uVar12 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar47._4_4_ = uVar12;
          auVar47._0_4_ = uVar12;
          auVar47._8_4_ = uVar12;
          auVar47._12_4_ = uVar12;
          uVar12 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar56._4_4_ = uVar12;
          auVar56._0_4_ = uVar12;
          auVar56._8_4_ = uVar12;
          auVar56._12_4_ = uVar12;
          auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + lVar16),auVar24);
          auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x10 + lVar16),auVar47);
          auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + lVar16),auVar56);
          auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x30 + lVar16),auVar24);
          auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x40 + lVar16),auVar47);
          auVar53 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x50 + lVar16),auVar56);
          auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x60 + lVar16),auVar24);
          auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x70 + lVar16),auVar47);
          auVar55 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x80 + lVar16),auVar56);
          local_1018 = vsubps_avx(auVar54,auVar43);
          local_1038 = vsubps_avx(auVar46,auVar44);
          local_1028 = vsubps_avx(auVar55,auVar35);
          auVar25._0_4_ = auVar43._0_4_ + auVar54._0_4_;
          auVar25._4_4_ = auVar43._4_4_ + auVar54._4_4_;
          auVar25._8_4_ = auVar43._8_4_ + auVar54._8_4_;
          auVar25._12_4_ = auVar43._12_4_ + auVar54._12_4_;
          auVar57._0_4_ = auVar44._0_4_ + auVar46._0_4_;
          auVar57._4_4_ = auVar44._4_4_ + auVar46._4_4_;
          auVar57._8_4_ = auVar44._8_4_ + auVar46._8_4_;
          auVar57._12_4_ = auVar44._12_4_ + auVar46._12_4_;
          fVar102 = auVar35._0_4_;
          auVar61._0_4_ = fVar102 + auVar55._0_4_;
          fVar104 = auVar35._4_4_;
          auVar61._4_4_ = fVar104 + auVar55._4_4_;
          fVar106 = auVar35._8_4_;
          auVar61._8_4_ = fVar106 + auVar55._8_4_;
          fVar108 = auVar35._12_4_;
          auVar61._12_4_ = fVar108 + auVar55._12_4_;
          auVar99._0_4_ = local_1028._0_4_ * auVar57._0_4_;
          auVar99._4_4_ = local_1028._4_4_ * auVar57._4_4_;
          auVar99._8_4_ = local_1028._8_4_ * auVar57._8_4_;
          auVar99._12_4_ = local_1028._12_4_ * auVar57._12_4_;
          auVar24 = vfmsub231ps_fma(auVar99,local_1038,auVar61);
          auVar62._0_4_ = auVar61._0_4_ * local_1018._0_4_;
          auVar62._4_4_ = auVar61._4_4_ * local_1018._4_4_;
          auVar62._8_4_ = auVar61._8_4_ * local_1018._8_4_;
          auVar62._12_4_ = auVar61._12_4_ * local_1018._12_4_;
          auVar66 = vfmsub231ps_fma(auVar62,local_1028,auVar25);
          auVar26._0_4_ = local_1038._0_4_ * auVar25._0_4_;
          auVar26._4_4_ = local_1038._4_4_ * auVar25._4_4_;
          auVar26._8_4_ = local_1038._8_4_ * auVar25._8_4_;
          auVar26._12_4_ = local_1038._12_4_ * auVar25._12_4_;
          auVar25 = vfmsub231ps_fma(auVar26,local_1018,auVar57);
          fVar101 = *(float *)(ray + k * 4 + 0x60);
          auVar58._0_4_ = fVar101 * auVar25._0_4_;
          auVar58._4_4_ = fVar101 * auVar25._4_4_;
          auVar58._8_4_ = fVar101 * auVar25._8_4_;
          auVar58._12_4_ = fVar101 * auVar25._12_4_;
          uVar12 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar83._4_4_ = uVar12;
          auVar83._0_4_ = uVar12;
          auVar83._8_4_ = uVar12;
          auVar83._12_4_ = uVar12;
          auVar66 = vfmadd231ps_fma(auVar58,auVar83,auVar66);
          uVar12 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar111._4_4_ = uVar12;
          auVar111._0_4_ = uVar12;
          auVar111._8_4_ = uVar12;
          auVar111._12_4_ = uVar12;
          local_1078 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar66,auVar111,auVar24);
          local_1048 = vsubps_avx(auVar44,auVar45);
          local_1058 = vsubps_avx(auVar35,auVar53);
          auVar67._0_4_ = auVar45._0_4_ + auVar44._0_4_;
          auVar67._4_4_ = auVar45._4_4_ + auVar44._4_4_;
          auVar67._8_4_ = auVar45._8_4_ + auVar44._8_4_;
          auVar67._12_4_ = auVar45._12_4_ + auVar44._12_4_;
          auVar63._0_4_ = fVar102 + auVar53._0_4_;
          auVar63._4_4_ = fVar104 + auVar53._4_4_;
          auVar63._8_4_ = fVar106 + auVar53._8_4_;
          auVar63._12_4_ = fVar108 + auVar53._12_4_;
          fVar109 = local_1058._0_4_;
          auVar71._0_4_ = auVar67._0_4_ * fVar109;
          fVar96 = local_1058._4_4_;
          auVar71._4_4_ = auVar67._4_4_ * fVar96;
          fVar90 = local_1058._8_4_;
          auVar71._8_4_ = auVar67._8_4_ * fVar90;
          fVar94 = local_1058._12_4_;
          auVar71._12_4_ = auVar67._12_4_ * fVar94;
          auVar66 = vfmsub231ps_fma(auVar71,local_1048,auVar63);
          local_1068 = vsubps_avx(auVar43,auVar34);
          fVar114 = local_1068._0_4_;
          auVar77._0_4_ = auVar63._0_4_ * fVar114;
          fVar98 = local_1068._4_4_;
          auVar77._4_4_ = auVar63._4_4_ * fVar98;
          fVar91 = local_1068._8_4_;
          auVar77._8_4_ = auVar63._8_4_ * fVar91;
          fVar95 = local_1068._12_4_;
          auVar77._12_4_ = auVar63._12_4_ * fVar95;
          auVar64._0_4_ = auVar43._0_4_ + auVar34._0_4_;
          auVar64._4_4_ = auVar43._4_4_ + auVar34._4_4_;
          auVar64._8_4_ = auVar43._8_4_ + auVar34._8_4_;
          auVar64._12_4_ = auVar43._12_4_ + auVar34._12_4_;
          auVar35 = vfmsub231ps_fma(auVar77,local_1058,auVar64);
          fVar92 = local_1048._0_4_;
          auVar65._0_4_ = auVar64._0_4_ * fVar92;
          fVar86 = local_1048._4_4_;
          auVar65._4_4_ = auVar64._4_4_ * fVar86;
          fVar93 = local_1048._8_4_;
          auVar65._8_4_ = auVar64._8_4_ * fVar93;
          fVar97 = local_1048._12_4_;
          auVar65._12_4_ = auVar64._12_4_ * fVar97;
          auVar24 = vfmsub231ps_fma(auVar65,local_1068,auVar67);
          auVar27._0_4_ = fVar101 * auVar24._0_4_;
          auVar27._4_4_ = fVar101 * auVar24._4_4_;
          auVar27._8_4_ = fVar101 * auVar24._8_4_;
          auVar27._12_4_ = fVar101 * auVar24._12_4_;
          auVar35 = vfmadd231ps_fma(auVar27,auVar83,auVar35);
          auVar24 = vfmadd231ps_fma(auVar35,auVar111,auVar66);
          auVar66 = vsubps_avx(auVar34,auVar54);
          auVar72._0_4_ = auVar34._0_4_ + auVar54._0_4_;
          auVar72._4_4_ = auVar34._4_4_ + auVar54._4_4_;
          auVar72._8_4_ = auVar34._8_4_ + auVar54._8_4_;
          auVar72._12_4_ = auVar34._12_4_ + auVar54._12_4_;
          auVar54 = vsubps_avx(auVar45,auVar46);
          auVar48._0_4_ = auVar45._0_4_ + auVar46._0_4_;
          auVar48._4_4_ = auVar45._4_4_ + auVar46._4_4_;
          auVar48._8_4_ = auVar45._8_4_ + auVar46._8_4_;
          auVar48._12_4_ = auVar45._12_4_ + auVar46._12_4_;
          auVar45 = vsubps_avx(auVar53,auVar55);
          auVar36._0_4_ = auVar53._0_4_ + auVar55._0_4_;
          auVar36._4_4_ = auVar53._4_4_ + auVar55._4_4_;
          auVar36._8_4_ = auVar53._8_4_ + auVar55._8_4_;
          auVar36._12_4_ = auVar53._12_4_ + auVar55._12_4_;
          auVar68._0_4_ = auVar45._0_4_ * auVar48._0_4_;
          auVar68._4_4_ = auVar45._4_4_ * auVar48._4_4_;
          auVar68._8_4_ = auVar45._8_4_ * auVar48._8_4_;
          auVar68._12_4_ = auVar45._12_4_ * auVar48._12_4_;
          auVar34 = vfmsub231ps_fma(auVar68,auVar54,auVar36);
          auVar37._0_4_ = auVar36._0_4_ * auVar66._0_4_;
          auVar37._4_4_ = auVar36._4_4_ * auVar66._4_4_;
          auVar37._8_4_ = auVar36._8_4_ * auVar66._8_4_;
          auVar37._12_4_ = auVar36._12_4_ * auVar66._12_4_;
          auVar35 = vfmsub231ps_fma(auVar37,auVar45,auVar72);
          auVar73._0_4_ = auVar54._0_4_ * auVar72._0_4_;
          auVar73._4_4_ = auVar54._4_4_ * auVar72._4_4_;
          auVar73._8_4_ = auVar54._8_4_ * auVar72._8_4_;
          auVar73._12_4_ = auVar54._12_4_ * auVar72._12_4_;
          auVar53 = vfmsub231ps_fma(auVar73,auVar66,auVar48);
          auVar49._0_4_ = fVar101 * auVar53._0_4_;
          auVar49._4_4_ = fVar101 * auVar53._4_4_;
          auVar49._8_4_ = fVar101 * auVar53._8_4_;
          auVar49._12_4_ = fVar101 * auVar53._12_4_;
          auVar35 = vfmadd231ps_fma(auVar49,auVar83,auVar35);
          auVar53 = vfmadd231ps_fma(auVar35,auVar111,auVar34);
          auVar84._0_4_ = auVar53._0_4_ + auVar24._0_4_ + local_1078.v[0];
          auVar84._4_4_ = auVar53._4_4_ + auVar24._4_4_ + local_1078.v[1];
          auVar84._8_4_ = auVar53._8_4_ + auVar24._8_4_ + local_1078.v[2];
          auVar84._12_4_ = auVar53._12_4_ + auVar24._12_4_ + local_1078.v[3];
          auVar69._8_4_ = 0x7fffffff;
          auVar69._0_8_ = 0x7fffffff7fffffff;
          auVar69._12_4_ = 0x7fffffff;
          auVar35 = vminps_avx((undefined1  [16])local_1078,auVar24);
          auVar35 = vminps_avx(auVar35,auVar53);
          local_1088 = vandps_avx(auVar84,auVar69);
          auVar78._0_4_ = local_1088._0_4_ * 1.1920929e-07;
          auVar78._4_4_ = local_1088._4_4_ * 1.1920929e-07;
          auVar78._8_4_ = local_1088._8_4_ * 1.1920929e-07;
          auVar78._12_4_ = local_1088._12_4_ * 1.1920929e-07;
          uVar21 = CONCAT44(auVar78._4_4_,auVar78._0_4_);
          auVar74._0_8_ = uVar21 ^ 0x8000000080000000;
          auVar74._8_4_ = -auVar78._8_4_;
          auVar74._12_4_ = -auVar78._12_4_;
          auVar35 = vcmpps_avx(auVar35,auVar74,5);
          auVar34 = vmaxps_avx((undefined1  [16])local_1078,auVar24);
          auVar34 = vmaxps_avx(auVar34,auVar53);
          auVar34 = vcmpps_avx(auVar34,auVar78,2);
          auVar35 = vorps_avx(auVar35,auVar34);
          if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar35[0xf] < '\0') {
            auVar50._0_4_ = fVar92 * local_1028._0_4_;
            auVar50._4_4_ = fVar86 * local_1028._4_4_;
            auVar50._8_4_ = fVar93 * local_1028._8_4_;
            auVar50._12_4_ = fVar97 * local_1028._12_4_;
            auVar75._0_4_ = fVar114 * local_1038._0_4_;
            auVar75._4_4_ = fVar98 * local_1038._4_4_;
            auVar75._8_4_ = fVar91 * local_1038._8_4_;
            auVar75._12_4_ = fVar95 * local_1038._12_4_;
            auVar53 = vfmsub213ps_fma(local_1038,local_1058,auVar50);
            auVar79._0_4_ = auVar54._0_4_ * fVar109;
            auVar79._4_4_ = auVar54._4_4_ * fVar96;
            auVar79._8_4_ = auVar54._8_4_ * fVar90;
            auVar79._12_4_ = auVar54._12_4_ * fVar94;
            auVar38._0_4_ = fVar114 * auVar45._0_4_;
            auVar38._4_4_ = fVar98 * auVar45._4_4_;
            auVar38._8_4_ = fVar91 * auVar45._8_4_;
            auVar38._12_4_ = fVar95 * auVar45._12_4_;
            auVar46 = vfmsub213ps_fma(auVar45,local_1048,auVar79);
            auVar34 = vandps_avx(auVar50,auVar69);
            auVar45 = vandps_avx(auVar79,auVar69);
            auVar34 = vcmpps_avx(auVar34,auVar45,1);
            local_1148 = vblendvps_avx(auVar46,auVar53,auVar34);
            auVar80._0_4_ = fVar92 * auVar66._0_4_;
            auVar80._4_4_ = fVar86 * auVar66._4_4_;
            auVar80._8_4_ = fVar93 * auVar66._8_4_;
            auVar80._12_4_ = fVar97 * auVar66._12_4_;
            auVar53 = vfmsub213ps_fma(auVar66,local_1058,auVar38);
            auVar87._0_4_ = local_1018._0_4_ * fVar109;
            auVar87._4_4_ = local_1018._4_4_ * fVar96;
            auVar87._8_4_ = local_1018._8_4_ * fVar90;
            auVar87._12_4_ = local_1018._12_4_ * fVar94;
            auVar46 = vfmsub213ps_fma(local_1028,local_1068,auVar87);
            auVar34 = vandps_avx(auVar87,auVar69);
            auVar45 = vandps_avx(auVar38,auVar69);
            auVar34 = vcmpps_avx(auVar34,auVar45,1);
            local_1138 = vblendvps_avx(auVar53,auVar46,auVar34);
            auVar53 = vfmsub213ps_fma(local_1018,local_1048,auVar75);
            auVar54 = vfmsub213ps_fma(auVar54,local_1068,auVar80);
            auVar34 = vandps_avx(auVar75,auVar69);
            auVar45 = vandps_avx(auVar80,auVar69);
            auVar34 = vcmpps_avx(auVar34,auVar45,1);
            local_1128 = vblendvps_avx(auVar54,auVar53,auVar34);
            auVar39._0_4_ = local_1128._0_4_ * fVar101;
            auVar39._4_4_ = local_1128._4_4_ * fVar101;
            auVar39._8_4_ = local_1128._8_4_ * fVar101;
            auVar39._12_4_ = local_1128._12_4_ * fVar101;
            auVar34 = vfmadd213ps_fma(auVar83,local_1138,auVar39);
            auVar34 = vfmadd213ps_fma(auVar111,local_1148,auVar34);
            auVar76._0_4_ = auVar34._0_4_ + auVar34._0_4_;
            auVar76._4_4_ = auVar34._4_4_ + auVar34._4_4_;
            auVar76._8_4_ = auVar34._8_4_ + auVar34._8_4_;
            auVar76._12_4_ = auVar34._12_4_ + auVar34._12_4_;
            auVar40._0_4_ = local_1128._0_4_ * fVar102;
            auVar40._4_4_ = local_1128._4_4_ * fVar104;
            auVar40._8_4_ = local_1128._8_4_ * fVar106;
            auVar40._12_4_ = local_1128._12_4_ * fVar108;
            auVar34 = vfmadd213ps_fma(auVar44,local_1138,auVar40);
            auVar43 = vfmadd213ps_fma(auVar43,local_1148,auVar34);
            auVar34 = vrcpps_avx(auVar76);
            auVar88._8_4_ = 0x3f800000;
            auVar88._0_8_ = 0x3f8000003f800000;
            auVar88._12_4_ = 0x3f800000;
            auVar44 = vfnmadd213ps_fma(auVar34,auVar76,auVar88);
            auVar34 = vfmadd132ps_fma(auVar44,auVar34,auVar34);
            local_1158._0_4_ = auVar34._0_4_ * (auVar43._0_4_ + auVar43._0_4_);
            local_1158._4_4_ = auVar34._4_4_ * (auVar43._4_4_ + auVar43._4_4_);
            local_1158._8_4_ = auVar34._8_4_ * (auVar43._8_4_ + auVar43._8_4_);
            local_1158._12_4_ = auVar34._12_4_ * (auVar43._12_4_ + auVar43._12_4_);
            auVar33 = ZEXT1664(local_1158);
            uVar12 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar41._4_4_ = uVar12;
            auVar41._0_4_ = uVar12;
            auVar41._8_4_ = uVar12;
            auVar41._12_4_ = uVar12;
            auVar34 = vcmpps_avx(auVar41,local_1158,2);
            uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar89._4_4_ = uVar12;
            auVar89._0_4_ = uVar12;
            auVar89._8_4_ = uVar12;
            auVar89._12_4_ = uVar12;
            auVar81 = ZEXT1664(auVar89);
            auVar43 = vcmpps_avx(local_1158,auVar89,2);
            auVar34 = vandps_avx(auVar34,auVar43);
            auVar43 = auVar35 & auVar34;
            if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar43[0xf] < '\0') {
              auVar35 = vandps_avx(auVar34,auVar35);
              auVar34 = vcmpps_avx(auVar76,_DAT_01f7aa10,4);
              auVar43 = auVar34 & auVar35;
              if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar43[0xf] < '\0') {
                valid.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar35,auVar34);
                tNear.field_0 = local_1078;
                pSVar5 = context->scene;
                auVar35 = vrcpps_avx(auVar84);
                auVar59._8_4_ = 0x3f800000;
                auVar59._0_8_ = 0x3f8000003f800000;
                auVar59._12_4_ = 0x3f800000;
                auVar34 = vfnmadd213ps_fma(auVar84,auVar35,auVar59);
                auVar34 = vfmadd132ps_fma(auVar34,auVar35,auVar35);
                auVar51._8_4_ = 0x219392ef;
                auVar51._0_8_ = 0x219392ef219392ef;
                auVar51._12_4_ = 0x219392ef;
                auVar35 = vcmpps_avx(local_1088,auVar51,5);
                auVar35 = vandps_avx(auVar34,auVar35);
                auVar28._0_4_ = local_1078.v[0] * auVar35._0_4_;
                auVar28._4_4_ = local_1078.v[1] * auVar35._4_4_;
                auVar28._8_4_ = local_1078.v[2] * auVar35._8_4_;
                auVar28._12_4_ = local_1078.v[3] * auVar35._12_4_;
                local_1178 = vminps_avx(auVar28,auVar59);
                auVar29._0_4_ = auVar24._0_4_ * auVar35._0_4_;
                auVar29._4_4_ = auVar24._4_4_ * auVar35._4_4_;
                auVar29._8_4_ = auVar24._8_4_ * auVar35._8_4_;
                auVar29._12_4_ = auVar24._12_4_ * auVar35._12_4_;
                local_1168 = vminps_avx(auVar29,auVar59);
                auVar52._8_4_ = 0x7f800000;
                auVar52._0_8_ = 0x7f8000007f800000;
                auVar52._12_4_ = 0x7f800000;
                auVar35 = vblendvps_avx(auVar52,local_1158,(undefined1  [16])valid.field_0);
                auVar34 = vshufps_avx(auVar35,auVar35,0xb1);
                auVar34 = vminps_avx(auVar34,auVar35);
                auVar43 = vshufpd_avx(auVar34,auVar34,1);
                auVar34 = vminps_avx(auVar43,auVar34);
                auVar35 = vcmpps_avx(auVar35,auVar34,0);
                auVar43 = (undefined1  [16])valid.field_0 & auVar35;
                auVar34 = vpcmpeqd_avx(auVar34,auVar34);
                if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar43[0xf] < '\0') {
                  auVar34 = auVar35;
                }
                lVar16 = lVar16 + uVar17;
                auVar35 = vandps_avx((undefined1  [16])valid.field_0,auVar34);
                uVar12 = vmovmskps_avx(auVar35);
                uVar21 = 0;
                for (uVar14 = CONCAT44((int)((ulong)pSVar5 >> 0x20),uVar12); (uVar14 & 1) == 0;
                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                  uVar21 = uVar21 + 1;
                }
                do {
                  uVar15 = *(uint *)(lVar16 + 0x90 + uVar21 * 4);
                  uVar14 = (ulong)uVar15;
                  pGVar6 = (pSVar5->geometries).items[uVar14].ptr;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    valid.field_0.v[uVar21] = 0.0;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar12 = *(undefined4 *)(local_1178 + uVar21 * 4);
                      uVar2 = *(undefined4 *)(local_1168 + uVar21 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + uVar21 * 4)
                      ;
                      *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1148 + uVar21 * 4)
                      ;
                      *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1138 + uVar21 * 4)
                      ;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1128 + uVar21 * 4)
                      ;
                      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar12;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                      *(undefined4 *)(ray + k * 4 + 0x110) =
                           *(undefined4 *)(lVar16 + 0xa0 + uVar21 * 4);
                      *(uint *)(ray + k * 4 + 0x120) = uVar15;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    uVar12 = *(undefined4 *)(local_1178 + uVar21 * 4);
                    local_fd8._4_4_ = uVar12;
                    local_fd8._0_4_ = uVar12;
                    local_fd8._8_4_ = uVar12;
                    local_fd8._12_4_ = uVar12;
                    local_fc8 = *(undefined4 *)(local_1168 + uVar21 * 4);
                    local_fa8._4_4_ = uVar15;
                    local_fa8._0_4_ = uVar15;
                    local_fa8._8_4_ = uVar15;
                    local_fa8._12_4_ = uVar15;
                    uVar12 = *(undefined4 *)(lVar16 + 0xa0 + uVar21 * 4);
                    auVar60._4_4_ = uVar12;
                    auVar60._0_4_ = uVar12;
                    auVar60._8_4_ = uVar12;
                    auVar60._12_4_ = uVar12;
                    uVar12 = *(undefined4 *)(local_1148 + uVar21 * 4);
                    uVar2 = *(undefined4 *)(local_1138 + uVar21 * 4);
                    local_ff8._4_4_ = uVar2;
                    local_ff8._0_4_ = uVar2;
                    local_ff8._8_4_ = uVar2;
                    local_ff8._12_4_ = uVar2;
                    uVar2 = *(undefined4 *)(local_1128 + uVar21 * 4);
                    local_fe8._4_4_ = uVar2;
                    local_fe8._0_4_ = uVar2;
                    local_fe8._8_4_ = uVar2;
                    local_fe8._12_4_ = uVar2;
                    local_1008[0] = (RTCHitN)(char)uVar12;
                    local_1008[1] = (RTCHitN)(char)((uint)uVar12 >> 8);
                    local_1008[2] = (RTCHitN)(char)((uint)uVar12 >> 0x10);
                    local_1008[3] = (RTCHitN)(char)((uint)uVar12 >> 0x18);
                    local_1008[4] = (RTCHitN)(char)uVar12;
                    local_1008[5] = (RTCHitN)(char)((uint)uVar12 >> 8);
                    local_1008[6] = (RTCHitN)(char)((uint)uVar12 >> 0x10);
                    local_1008[7] = (RTCHitN)(char)((uint)uVar12 >> 0x18);
                    local_1008[8] = (RTCHitN)(char)uVar12;
                    local_1008[9] = (RTCHitN)(char)((uint)uVar12 >> 8);
                    local_1008[10] = (RTCHitN)(char)((uint)uVar12 >> 0x10);
                    local_1008[0xb] = (RTCHitN)(char)((uint)uVar12 >> 0x18);
                    local_1008[0xc] = (RTCHitN)(char)uVar12;
                    local_1008[0xd] = (RTCHitN)(char)((uint)uVar12 >> 8);
                    local_1008[0xe] = (RTCHitN)(char)((uint)uVar12 >> 0x10);
                    local_1008[0xf] = (RTCHitN)(char)((uint)uVar12 >> 0x18);
                    uStack_fc4 = local_fc8;
                    uStack_fc0 = local_fc8;
                    uStack_fbc = local_fc8;
                    local_fb8 = auVar60;
                    vpcmpeqd_avx2(ZEXT1632(local_fd8),ZEXT1632(local_fd8));
                    uStack_f94 = context->user->instID[0];
                    local_f98 = uStack_f94;
                    uStack_f90 = uStack_f94;
                    uStack_f8c = uStack_f94;
                    uStack_f88 = context->user->instPrimID[0];
                    uStack_f84 = uStack_f88;
                    uStack_f80 = uStack_f88;
                    uStack_f7c = uStack_f88;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + uVar21 * 4);
                    local_1238 = *local_1220;
                    args.valid = (int *)local_1238;
                    args.geometryUserPtr = pGVar6->userPtr;
                    args.context = context->user;
                    args.hit = local_1008;
                    args.N = 4;
                    auVar35 = auVar33._0_16_;
                    auVar34 = auVar81._0_16_;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar6->intersectionFilterN)(&args);
                      auVar81 = ZEXT1664(auVar34);
                      auVar33 = ZEXT1664(auVar35);
                    }
                    if (local_1238 == (undefined1  [16])0x0) {
                      auVar35 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar35 = auVar35 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var7)(&args);
                        auVar81 = ZEXT1664(auVar34);
                        auVar33 = ZEXT1664(auVar35);
                      }
                      auVar34 = vpcmpeqd_avx(local_1238,_DAT_01f7aa10);
                      auVar43 = vpcmpeqd_avx(auVar60,auVar60);
                      auVar35 = auVar34 ^ auVar43;
                      if (local_1238 != (undefined1  [16])0x0) {
                        auVar34 = auVar34 ^ auVar43;
                        auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])args.hit);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar43;
                        auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x10));
                        *(undefined1 (*) [16])(args.ray + 0xd0) = auVar43;
                        auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x20));
                        *(undefined1 (*) [16])(args.ray + 0xe0) = auVar43;
                        auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x30));
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar43;
                        auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x40));
                        *(undefined1 (*) [16])(args.ray + 0x100) = auVar43;
                        auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x50));
                        *(undefined1 (*) [16])(args.ray + 0x110) = auVar43;
                        auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x60));
                        *(undefined1 (*) [16])(args.ray + 0x120) = auVar43;
                        auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x70));
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar43;
                        auVar34 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x80));
                        *(undefined1 (*) [16])(args.ray + 0x140) = auVar34;
                      }
                    }
                    auVar31._8_8_ = 0x100000001;
                    auVar31._0_8_ = 0x100000001;
                    if ((auVar31 & auVar35) == (undefined1  [16])0x0) {
                      *(int *)(ray + k * 4 + 0x80) = auVar81._0_4_;
                    }
                    else {
                      auVar81 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                    }
                    valid.field_0.v[uVar21] = 0.0;
                    uVar12 = auVar81._0_4_;
                    auVar32._4_4_ = uVar12;
                    auVar32._0_4_ = uVar12;
                    auVar32._8_4_ = uVar12;
                    auVar32._12_4_ = uVar12;
                    auVar35 = vcmpps_avx(auVar33._0_16_,auVar32,2);
                    valid.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         vandps_avx(auVar35,(undefined1  [16])valid.field_0);
                    uVar14 = uVar21;
                  }
                  if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                        (undefined1  [16])0x0 &&
                       ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
                       (undefined1  [16])0x0) &&
                      ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) break;
                  auVar42._8_4_ = 0x7f800000;
                  auVar42._0_8_ = 0x7f8000007f800000;
                  auVar42._12_4_ = 0x7f800000;
                  auVar35 = vblendvps_avx(auVar42,auVar33._0_16_,(undefined1  [16])valid.field_0);
                  auVar34 = vshufps_avx(auVar35,auVar35,0xb1);
                  auVar34 = vminps_avx(auVar34,auVar35);
                  auVar43 = vshufpd_avx(auVar34,auVar34,1);
                  auVar34 = vminps_avx(auVar43,auVar34);
                  auVar35 = vcmpps_avx(auVar35,auVar34,0);
                  auVar34 = (undefined1  [16])valid.field_0 & auVar35;
                  aVar30 = valid.field_0;
                  if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar34[0xf] < '\0') {
                    aVar30.v = (__m128)vandps_avx(auVar35,valid.field_0);
                  }
                  uVar12 = vmovmskps_avx((undefined1  [16])aVar30);
                  uVar21 = 0;
                  for (uVar14 = CONCAT44((int)(uVar14 >> 0x20),uVar12); (uVar14 & 1) == 0;
                      uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                    uVar21 = uVar21 + 1;
                  }
                } while( true );
              }
            }
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != local_1218);
      }
      uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar33 = ZEXT1664(CONCAT412(uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12))));
      auVar81 = ZEXT1664(local_1098);
      auVar82 = ZEXT1664(local_10a8);
      auVar85 = ZEXT1664(local_10b8);
      fVar86 = local_10c8;
      fVar90 = fStack_10c4;
      fVar91 = fStack_10c0;
      fVar92 = fStack_10bc;
      fVar93 = local_10d8;
      fVar94 = fStack_10d4;
      fVar95 = fStack_10d0;
      fVar96 = fStack_10cc;
      fVar97 = local_10e8;
      fVar102 = fStack_10e4;
      fVar104 = fStack_10e0;
      fVar98 = fStack_10dc;
      fVar106 = local_10f8;
      fVar108 = fStack_10f4;
      fVar100 = fStack_10f0;
      fVar101 = fStack_10ec;
      fVar103 = local_1108;
      fVar105 = fStack_1104;
      fVar107 = fStack_1100;
      fVar109 = fStack_10fc;
      fVar110 = local_1118;
      fVar112 = fStack_1114;
      fVar113 = fStack_1110;
      fVar114 = fStack_110c;
    }
    if (pSVar13 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }